

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::encode_golomb(symbol_codec *this,uint v,uint m)

{
  uint num_bits;
  ulong uVar1;
  
  uVar1 = (ulong)v / (ulong)m;
  num_bits = (uint)uVar1;
  while (0x10 < num_bits) {
    record_put_bits(this,0xffff,0x10);
    num_bits = (int)uVar1 - 0x10;
    uVar1 = (ulong)num_bits;
  }
  if (num_bits != 0) {
    encode_bits(this,~(-1 << ((byte)num_bits & 0x1f)),num_bits);
  }
  record_put_bits(this,0,1);
  encode_truncated_binary(this,v % m,m);
  return;
}

Assistant:

void symbol_codec::encode_golomb(uint v, uint m) {
  CRNLIB_ASSERT(m > 0);

  uint q = v / m;
  uint r = v % m;

  while (q > 16) {
    encode_bits(0xFFFF, 16);
    q -= 16;
  }

  if (q)
    encode_bits((1 << q) - 1, q);

  encode_bits(0, 1);

  encode_truncated_binary(r, m);
}